

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O1

void __thiscall Permutazione::somma(Permutazione *this,Permutazione *p)

{
  ushort uVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  unsigned_short *puVar4;
  ulong uVar5;
  
  uVar1 = this->dimensione;
  puVar4 = (unsigned_short *)operator_new__((ulong)((uint)uVar1 + (uint)uVar1));
  if (uVar1 != 0) {
    puVar2 = p->individuo;
    puVar3 = this->individuo;
    uVar5 = 0;
    do {
      puVar4[uVar5] = puVar2[puVar3[uVar5]];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (this->individuo != (unsigned_short *)0x0) {
    operator_delete__(this->individuo);
  }
  this->individuo = puVar4;
  return;
}

Assistant:

void Permutazione::somma(Permutazione* p) {

	unsigned short* individuo = new unsigned short[dimensione];

	for (unsigned short k = 0; k < dimensione; k++) {
		individuo[k] = p->individuo[this->individuo[k]];
	}

	delete[] this->individuo;
	this->individuo = individuo;
}